

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O1

ssize_t __thiscall serial::Serial::read(Serial *this,int __fd,void *__buf,size_t __nbytes)

{
  SerialImpl *this_00;
  ssize_t sVar1;
  
  this_00 = this->pimpl_;
  SerialImpl::readLock(this_00);
  sVar1 = SerialImpl::read(this->pimpl_,__fd,__buf,__nbytes);
  SerialImpl::readUnlock(this_00);
  return sVar1;
}

Assistant:

size_t
Serial::read (uint8_t *buffer, size_t size)
{
  ScopedReadLock lock(this->pimpl_);
  return this->pimpl_->read (buffer, size);
}